

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_crypt_and_tag
              (mbedtls_gcm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,size_t tag_len,uchar *tag)

{
  int iVar1;
  uchar *in_RCX;
  size_t *in_RDX;
  undefined4 in_ESI;
  size_t *in_RDI;
  size_t in_R8;
  size_t olen;
  uchar *in_stack_00000008;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mbedtls_gcm_starts((mbedtls_gcm_context *)iv_len,add._4_4_,in_stack_00000008,olen);
  if ((((iVar1 == 0) &&
       (iVar1 = mbedtls_gcm_update_ad
                          ((mbedtls_gcm_context *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           (uchar *)in_RDX,(size_t)in_RCX), iVar1 == 0)) &&
      (iVar1 = mbedtls_gcm_update((mbedtls_gcm_context *)iv_len,add,(size_t)in_stack_00000008,
                                  (uchar *)olen,
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI), iVar1 == 0)) &&
     (iVar1 = mbedtls_gcm_finish((mbedtls_gcm_context *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (uchar *)in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                                 in_RCX,in_R8), iVar1 == 0)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_crypt_and_tag(mbedtls_gcm_context *ctx,
                              int mode,
                              size_t length,
                              const unsigned char *iv,
                              size_t iv_len,
                              const unsigned char *add,
                              size_t add_len,
                              const unsigned char *input,
                              unsigned char *output,
                              size_t tag_len,
                              unsigned char *tag)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    if ((ret = mbedtls_gcm_starts(ctx, mode, iv, iv_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_gcm_update_ad(ctx, add, add_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_gcm_update(ctx, input, length,
                                  output, length, &olen)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_gcm_finish(ctx, NULL, 0, &olen, tag, tag_len)) != 0) {
        return ret;
    }

    return 0;
}